

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O3

void __thiscall QPainterPathStroker::QPainterPathStroker(QPainterPathStroker *this,QPen *pen)

{
  bool bVar1;
  PenCapStyle style;
  LineJoinMode LVar2;
  PenJoinStyle joinStyle;
  PenStyle PVar3;
  QPainterPathStrokerPrivate *pQVar4;
  long in_FS_OFFSET;
  qreal qVar5;
  double dVar6;
  QList<double> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = (QPainterPathStrokerPrivate *)operator_new(0xd0);
  QStroker::QStroker((QStroker *)pQVar4);
  (pQVar4->dashPattern).d.size = 0;
  pQVar4->dashOffset = 0.0;
  (pQVar4->dashPattern).d.d = (Data *)0x0;
  (pQVar4->dashPattern).d.ptr = (double *)0x0;
  (pQVar4->stroker).super_QStrokerOps.m_moveTo = qt_path_stroke_move_to;
  (pQVar4->stroker).super_QStrokerOps.m_lineTo = qt_path_stroke_line_to;
  (pQVar4->stroker).super_QStrokerOps.m_cubicTo = qt_path_stroke_cubic_to;
  (this->d_ptr).d = pQVar4;
  qVar5 = QPen::widthF(pen);
  pQVar4 = (this->d_ptr).d;
  dVar6 = (double)(~-(ulong)(0.0 < qVar5) & 0x3ff0000000000000 |
                  (ulong)qVar5 & -(ulong)(0.0 < qVar5));
  (pQVar4->stroker).m_strokeWidth = dVar6;
  dVar6 = 1.0 / dVar6;
  bVar1 = 0.25 < dVar6;
  if (dVar6 <= 0.00025) {
    dVar6 = 0.00025;
  }
  (pQVar4->stroker).super_QStrokerOps.m_curveThreshold =
       (qfixed)(-(ulong)bVar1 & 0x3fd0000000000000 | ~-(ulong)bVar1 & (ulong)dVar6);
  style = QPen::capStyle(pen);
  pQVar4 = (this->d_ptr).d;
  LVar2 = QStroker::joinModeForCap(style);
  (pQVar4->stroker).m_capStyle = LVar2;
  joinStyle = QPen::joinStyle(pen);
  pQVar4 = (this->d_ptr).d;
  LVar2 = QStroker::joinModeForJoin(joinStyle);
  (pQVar4->stroker).m_joinStyle = LVar2;
  qVar5 = QPen::miterLimit(pen);
  (((this->d_ptr).d)->stroker).m_miterLimit = qVar5;
  qVar5 = QPen::dashOffset(pen);
  ((this->d_ptr).d)->dashOffset = qVar5;
  PVar3 = QPen::style(pen);
  if (PVar3 == CustomDashLine) {
    QPen::dashPattern(&local_38,pen);
    setDashPattern(this,&local_38);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,8,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else {
    PVar3 = QPen::style(pen);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      setDashPattern(this,PVar3);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

QPainterPathStroker::QPainterPathStroker(const QPen &pen)
    : d_ptr(new QPainterPathStrokerPrivate)
{
    setWidth(pen.widthF());
    setCapStyle(pen.capStyle());
    setJoinStyle(pen.joinStyle());
    setMiterLimit(pen.miterLimit());
    setDashOffset(pen.dashOffset());

    if (pen.style() == Qt::CustomDashLine)
        setDashPattern(pen.dashPattern());
    else
        setDashPattern(pen.style());
}